

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmfont.c
# Opt level: O1

int each_character(ALLEGRO_FONT *f,ALLEGRO_COLOR color,ALLEGRO_USTR *text,float x,float y,
                  ALLEGRO_GLYPH *glyph,
                  _func_int_ALLEGRO_FONT_ptr_ALLEGRO_COLOR_int_float_float_ALLEGRO_GLYPH_ptr *cb)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  int pos;
  
  piVar2 = (int *)f->data;
  iVar4 = 0;
  iVar7 = 0;
  do {
    iVar3 = al_ustr_get_next(text);
    if (-1 < iVar3) {
      piVar5 = piVar2;
      if (iVar4 != 0) {
        do {
          piVar5 = *(int **)(piVar5 + 4);
          if (piVar5 == (int *)0x0) {
            lVar6 = 0;
            goto LAB_001061cc;
          }
          iVar1 = *piVar5;
        } while ((iVar4 < iVar1) || (iVar1 + piVar5[1] <= iVar4));
        lVar6 = *(long *)(*(long *)(piVar5 + 2) + (long)(iVar4 - iVar1) * 8);
LAB_001061cc:
        iVar4 = 0;
        if ((lVar6 != 0) && (iVar4 = 0, 0 < (long)*(int *)(lVar6 + 0x24))) {
          lVar8 = 0;
          do {
            if (*(int *)(*(long *)(lVar6 + 0x28) + 4 + lVar8) == iVar3) {
              iVar4 = *(int *)(*(long *)(lVar6 + 0x28) + 8 + lVar8);
              break;
            }
            lVar8 = lVar8 + 0xc;
          } while ((long)*(int *)(lVar6 + 0x24) * 0xc != lVar8);
        }
        iVar7 = iVar7 + iVar4;
      }
      iVar4 = (*cb)(f,color,iVar3,(float)iVar7 + x,y,glyph);
      iVar7 = iVar7 + iVar4;
      iVar4 = iVar3;
    }
    if (iVar3 < 0) {
      return iVar7;
    }
  } while( true );
}

Assistant:

static int each_character(const ALLEGRO_FONT *f, ALLEGRO_COLOR color,
      const ALLEGRO_USTR *text, float x, float y, ALLEGRO_GLYPH *glyph,
      int (*cb)(const ALLEGRO_FONT *f, ALLEGRO_COLOR color, int ch,
      float x, float y, ALLEGRO_GLYPH *glyph)) {
   BMFONT_DATA *data = f->data;
   int pos = 0;
   int advance = 0;
   int prev = 0;
   while (true) {
      int c = al_ustr_get_next(text, &pos);
      if (c < 0) break;
      if (prev) {
         BMFONT_CHAR *pc = find_codepoint(data, prev);
         advance += get_kerning(pc, c);
      }
      advance += cb(f, color, c, x + advance, y, glyph);
      prev = c;
   }
   return advance;
}